

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool httplib::detail::make_multipart_ranges_data
               (Request *req,Response *res,string *boundary,string *content_type,string *data)

{
  anon_class_16_2_20c26d81 content;
  bool bVar1;
  string *data_local;
  string *content_type_local;
  string *boundary_local;
  Response *res_local;
  Request *req_local;
  
  content.data = data;
  content.res = res;
  bVar1 = process_multipart_ranges_data<httplib::detail::make_multipart_ranges_data(httplib::Request_const&,httplib::Response&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string&)::_lambda(std::__cxx11::string_const&)_1_,httplib::detail::make_multipart_ranges_data(httplib::Request_const&,httplib::Response&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string&)::_lambda(char_const*)_1_,httplib::detail::make_multipart_ranges_data(httplib::Request_const&,httplib::Response&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string&)::_lambda(unsigned_long,unsigned_long)_1_>
                    (req,res,boundary,content_type,(anon_class_8_1_898a9ca8)data,
                     (anon_class_8_1_898a9ca8)data,content);
  return bVar1;
}

Assistant:

inline bool make_multipart_ranges_data(const Request &req, Response &res,
											   const std::string &boundary,
											   const std::string &content_type,
											   std::string &data) {
			return process_multipart_ranges_data(
					req, res, boundary, content_type,
					[&](const std::string &token) { data += token; },
					[&](const char *token) { data += token; },
					[&](size_t offset, size_t length) {
						if (offset < res.body.size()) {
							data += res.body.substr(offset, length);
							return true;
						}
						return false;
					});
		}